

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_construct_any_const.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  long *plVar2;
  double *pdVar3;
  any b;
  any local_20;
  
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&PTR__erasure_00103d70;
  plVar2[1] = 0x400921f9f01b866e;
  local_20._value = (erasure *)operator_new(0x10);
  (local_20._value)->_vptr_erasure = (_func_int **)&PTR__erasure_00103d70;
  local_20._value[1]._vptr_erasure = (_func_int **)0x400921f9f01b866e;
  pdVar3 = type::any::as<double>(&local_20);
  dVar1 = *pdVar3;
  if (local_20._value != (erasure *)0x0) {
    (*(local_20._value)->_vptr_erasure[1])();
  }
  (**(code **)(*plVar2 + 8))(plVar2);
  return -(uint)(dVar1 != 3.14159);
}

Assistant:

int main() {
  try {
    type::any a(3.14159);
    type::any b(a);
    if(b.as<double>() == 3.14159) {
      return 0;
    }
    return -1;
  }
  catch(...) {
    return -1;
  }
}